

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *structNode,Reader *replacement,uint64_t scopeId,
          uint64_t replacementScopeId)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  ElementCount EVar5;
  ushort uVar6;
  int iVar7;
  ushort uVar8;
  ElementCount index;
  Reader *this_00;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  uint64_t replacementScopeId_local;
  uint64_t scopeId_local;
  Reader fields;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition_1;
  Reader replacementFields;
  Fault f_1;
  
  uVar1 = (replacement->_reader).dataSize;
  if (uVar1 < 0x80) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)((long)(replacement->_reader).data + 0xe);
  }
  uVar2 = (structNode->_reader).dataSize;
  if (uVar2 < 0x80) {
    uVar8 = 0;
  }
  else {
    uVar8 = *(ushort *)((long)(structNode->_reader).data + 0xe);
  }
  replacementScopeId_local = replacementScopeId;
  scopeId_local = scopeId;
  if (uVar8 < uVar6) {
    replacementIsNewer(this);
  }
  else {
    if (uVar1 < 0x80) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ushort *)((long)(replacement->_reader).data + 0xe);
    }
    if (uVar2 < 0x80) {
      uVar8 = 0;
    }
    else {
      uVar8 = *(ushort *)((long)(structNode->_reader).data + 0xe);
    }
    if (uVar6 < uVar8) {
      replacementIsOlder(this);
    }
  }
  uVar1 = (replacement->_reader).dataSize;
  if (uVar1 < 0xd0) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)((long)(replacement->_reader).data + 0x18);
  }
  uVar2 = (structNode->_reader).dataSize;
  if (uVar2 < 0xd0) {
    uVar8 = 0;
  }
  else {
    uVar8 = *(ushort *)((long)(structNode->_reader).data + 0x18);
  }
  if (uVar8 < uVar6) {
    replacementIsNewer(this);
  }
  else {
    if (uVar1 < 0xd0) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ushort *)((long)(replacement->_reader).data + 0x18);
    }
    if (uVar2 < 0xd0) {
      uVar8 = 0;
    }
    else {
      uVar8 = *(ushort *)((long)(structNode->_reader).data + 0x18);
    }
    if (uVar6 < uVar8) {
      replacementIsOlder(this);
    }
  }
  uVar1 = (replacement->_reader).dataSize;
  if (uVar1 < 0x100) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)((long)(replacement->_reader).data + 0x1e);
  }
  uVar2 = (structNode->_reader).dataSize;
  if (uVar2 < 0x100) {
    uVar8 = 0;
  }
  else {
    uVar8 = *(ushort *)((long)(structNode->_reader).data + 0x1e);
  }
  if (uVar8 < uVar6) {
    replacementIsNewer(this);
  }
  else {
    if (uVar1 < 0x100) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ushort *)((long)(replacement->_reader).data + 0x1e);
    }
    if (uVar2 < 0x100) {
      uVar8 = 0;
    }
    else {
      uVar8 = *(ushort *)((long)(structNode->_reader).data + 0x1e);
    }
    if (uVar6 < uVar8) {
      replacementIsOlder(this);
    }
  }
  uVar1 = (replacement->_reader).dataSize;
  if ((((0xff < uVar1) &&
       (pvVar3 = (replacement->_reader).data, *(short *)((long)pvVar3 + 0x1e) != 0)) &&
      (uVar2 = (structNode->_reader).dataSize, 0xff < uVar2)) &&
     (pvVar4 = (structNode->_reader).data, *(short *)((long)pvVar4 + 0x1e) != 0)) {
    fields.reader.segment._4_4_ = 0;
    fields.reader.segment._0_4_ = 0;
    if (0x11f < uVar1) {
      fields.reader.segment._0_4_ = *(int *)((long)pvVar3 + 0x20);
    }
    if (0x11f < uVar2) {
      fields.reader.segment._4_4_ = *(int *)((long)pvVar4 + 0x20);
    }
    fields.reader.capTable = (CapTableReader *)anon_var_dwarf_3c21f;
    fields.reader.ptr = &DAT_00000005;
    fields.reader.elementCount =
         CONCAT31(fields.reader.elementCount._1_3_,
                  (int)fields.reader.segment == fields.reader.segment._4_4_);
    if ((int)fields.reader.segment != fields.reader.segment._4_4_) {
      this_00 = &replacementFields;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,char_const(&)[36]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x2f9,FAILED,
                 "replacement.getDiscriminantOffset() == structNode.getDiscriminantOffset()",
                 "_kjCondition,\"union discriminant position changed\"",
                 (DebugComparison<unsigned_int,_unsigned_int> *)&fields,
                 (char (*) [36])"union discriminant position changed");
      this->compatibility = INCOMPATIBLE;
      goto LAB_0037d6c4;
    }
  }
  bVar9 = (structNode->_reader).pointerCount < 4;
  replacementFields.reader.ptr = (byte *)((structNode->_reader).pointers + 3);
  if (bVar9) {
    replacementFields.reader.ptr = (byte *)(WirePointer *)0x0;
  }
  iVar7 = 0x7fffffff;
  replacementFields.reader.elementCount = (structNode->_reader).nestingLimit;
  if (bVar9) {
    replacementFields.reader.elementCount = 0x7fffffff;
    replacementFields.reader.segment._0_4_ = 0;
    replacementFields.reader.segment._4_4_ = 0;
    replacementFields.reader.capTable._0_4_ = 0;
    replacementFields.reader.capTable._4_4_ = 0;
  }
  else {
    replacementFields.reader.segment._0_4_ = *(undefined4 *)&(structNode->_reader).segment;
    replacementFields.reader.segment._4_4_ =
         *(undefined4 *)((long)&(structNode->_reader).segment + 4);
    replacementFields.reader.capTable._0_4_ = *(undefined4 *)&(structNode->_reader).capTable;
    replacementFields.reader.capTable._4_4_ =
         *(undefined4 *)((long)&(structNode->_reader).capTable + 4);
  }
  capnp::_::PointerReader::getList
            (&fields.reader,(PointerReader *)&replacementFields,INLINE_COMPOSITE,(word *)0x0);
  bVar9 = 3 < (replacement->_reader).pointerCount;
  _kjCondition_1.op.content.ptr = (char *)(WirePointer *)0x0;
  if (bVar9) {
    iVar7 = (replacement->_reader).nestingLimit;
    _kjCondition_1.op.content.ptr = (char *)((replacement->_reader).pointers + 3);
  }
  uVar10 = 0;
  uVar11 = 0;
  uVar12 = 0;
  uVar13 = 0;
  if (bVar9) {
    uVar10 = *(undefined4 *)&(replacement->_reader).segment;
    uVar11 = *(undefined4 *)((long)&(replacement->_reader).segment + 4);
    uVar12 = *(undefined4 *)&(replacement->_reader).capTable;
    uVar13 = *(undefined4 *)((long)&(replacement->_reader).capTable + 4);
  }
  _kjCondition_1.left = (unsigned_long *)CONCAT44(uVar11,uVar10);
  _kjCondition_1.right = (unsigned_long *)CONCAT44(uVar13,uVar12);
  _kjCondition_1.op.content.size_ = CONCAT44(_kjCondition_1.op.content.size_._4_4_,iVar7);
  capnp::_::PointerReader::getList
            (&replacementFields.reader,(PointerReader *)&_kjCondition_1,INLINE_COMPOSITE,(word *)0x0
            );
  EVar5 = replacementFields.reader.elementCount;
  if (fields.reader.elementCount < replacementFields.reader.elementCount) {
    EVar5 = fields.reader.elementCount;
  }
  if (fields.reader.elementCount < replacementFields.reader.elementCount) {
    replacementIsNewer(this);
  }
  else if (replacementFields.reader.elementCount < fields.reader.elementCount) {
    replacementIsOlder(this);
  }
  if (EVar5 != 0) {
    index = 0;
    do {
      capnp::_::ListReader::getStructElement((StructReader *)&_kjCondition_1,&fields.reader,index);
      capnp::_::ListReader::getStructElement((StructReader *)&f_1,&replacementFields.reader,index);
      checkCompatibility(this,(Reader *)&_kjCondition_1,(Reader *)&f_1);
      index = index + 1;
    } while (EVar5 != index);
  }
  if (((structNode->_reader).dataSize < 0xe1) ||
     ((*(byte *)((long)(structNode->_reader).data + 0x1c) & 1) == 0)) {
    if ((replacement->_reader).dataSize < 0xe1) {
      return;
    }
    if ((*(byte *)((long)(replacement->_reader).data + 0x1c) & 1) == 0) {
      return;
    }
    replacementIsNewer(this);
    return;
  }
  if (((replacement->_reader).dataSize < 0xe1) ||
     ((*(byte *)((long)(replacement->_reader).data + 0x1c) & 1) == 0)) {
    replacementIsOlder(this);
    return;
  }
  _kjCondition_1.left = &replacementScopeId_local;
  _kjCondition_1.right = &scopeId_local;
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  _kjCondition_1.result = replacementScopeId == scopeId;
  if (_kjCondition_1.result) {
    return;
  }
  this_00 = (Reader *)&f_1;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[27]>
            ((Fault *)this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
             ,0x314,FAILED,"replacementScopeId == scopeId",
             "_kjCondition,\"group node\'s scope changed\"",&_kjCondition_1,
             (char (*) [27])"group node\'s scope changed");
  this->compatibility = INCOMPATIBLE;
LAB_0037d6c4:
  kj::_::Debug::Fault::~Fault((Fault *)this_00);
  return;
}

Assistant:

void checkCompatibility(const schema::Node::Struct::Reader& structNode,
                          const schema::Node::Struct::Reader& replacement,
                          uint64_t scopeId, uint64_t replacementScopeId) {
    if (replacement.getDataWordCount() > structNode.getDataWordCount()) {
      replacementIsNewer();
    } else if (replacement.getDataWordCount() < structNode.getDataWordCount()) {
      replacementIsOlder();
    }
    if (replacement.getPointerCount() > structNode.getPointerCount()) {
      replacementIsNewer();
    } else if (replacement.getPointerCount() < structNode.getPointerCount()) {
      replacementIsOlder();
    }
    if (replacement.getDiscriminantCount() > structNode.getDiscriminantCount()) {
      replacementIsNewer();
    } else if (replacement.getDiscriminantCount() < structNode.getDiscriminantCount()) {
      replacementIsOlder();
    }

    if (replacement.getDiscriminantCount() > 0 && structNode.getDiscriminantCount() > 0) {
      VALIDATE_SCHEMA(replacement.getDiscriminantOffset() == structNode.getDiscriminantOffset(),
                      "union discriminant position changed");
    }

    // The shared members should occupy corresponding positions in the member lists, since the
    // lists are sorted by ordinal.
    auto fields = structNode.getFields();
    auto replacementFields = replacement.getFields();
    uint count = kj::min(fields.size(), replacementFields.size());

    if (replacementFields.size() > fields.size()) {
      replacementIsNewer();
    } else if (replacementFields.size() < fields.size()) {
      replacementIsOlder();
    }

    for (uint i = 0; i < count; i++) {
      checkCompatibility(fields[i], replacementFields[i]);
    }

    // For the moment, we allow "upgrading" from non-group to group, mainly so that the
    // placeholders we generate for group parents (which in the absence of more info, we assume to
    // be non-groups) can be replaced with groups.
    //
    // TODO(cleanup):  The placeholder approach is really breaking down.  Maybe we need to maintain
    //   a list of expectations for nodes we haven't loaded yet.
    if (structNode.getIsGroup()) {
      if (replacement.getIsGroup()) {
        VALIDATE_SCHEMA(replacementScopeId == scopeId, "group node's scope changed");
      } else {
        replacementIsOlder();
      }
    } else {
      if (replacement.getIsGroup()) {
        replacementIsNewer();
      }
    }
  }